

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pztransfer.cpp
# Opt level: O2

void __thiscall
TPZTransfer<std::complex<float>_>::ExpandColumnVectorEntries
          (TPZTransfer<std::complex<float>_> *this,int num)

{
  TPZManVector<int,_10> *this_00;
  TPZManVector<int,_10> *this_01;
  long newsize;
  long lVar1;
  int local_30 [2];
  
  this_00 = &this->fColumnBlockNumber;
  this_01 = &this->fColumnBlockPosition;
  while( true ) {
    newsize = (long)this->fColumnBlockLastUsed + (long)num;
    lVar1 = (this->fColumnBlockNumber).super_TPZVec<int>.fNAlloc;
    if (newsize <= lVar1) break;
    lVar1 = (long)((int)lVar1 + 1000);
    TPZManVector<int,_10>::Expand(this_00,lVar1);
    TPZManVector<int,_10>::Expand(this_01,lVar1);
  }
  TPZManVector<int,_10>::Resize(this_00,newsize);
  local_30[1] = 0xffffffff;
  TPZVec<int>::Fill(&this_00->super_TPZVec<int>,local_30 + 1,(long)this->fColumnBlockLastUsed,-1);
  TPZManVector<int,_10>::Resize(this_01,(long)this->fColumnBlockLastUsed + (long)num);
  local_30[0] = 0;
  TPZVec<int>::Fill(&this_01->super_TPZVec<int>,local_30,(long)this->fColumnBlockLastUsed,-1);
  return;
}

Assistant:

void TPZTransfer<TVar>::ExpandColumnVectorEntries(int num){
	while(fColumnBlockLastUsed+num > fColumnBlockNumber.NAlloc()) {
		int nextsize = fColumnBlockNumber.NAlloc()+1000;
		fColumnBlockNumber.Expand(nextsize);
		fColumnBlockPosition.Expand(nextsize);
	}
	fColumnBlockNumber.Resize(fColumnBlockLastUsed+num);
	fColumnBlockNumber.Fill(-1,fColumnBlockLastUsed);
	fColumnBlockPosition.Resize(fColumnBlockLastUsed+num);
	fColumnBlockPosition.Fill(0,fColumnBlockLastUsed);
}